

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingSphereRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::BoundingSphereRecord::Encode(BoundingSphereRecord *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_CentLocation,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32Rad);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void BoundingSphereRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << m_f32Rad
           << m_ui32Padding;
}